

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::DescriptorPoolExtensionFinder::Find
          (DescriptorPoolExtensionFinder *this,int number,ExtensionInfo *output)

{
  MessageFactory *pMVar1;
  uint uVar2;
  int iVar3;
  FieldDescriptor *this_00;
  Descriptor *pDVar4;
  undefined4 extraout_var;
  LogMessage *pLVar5;
  EnumDescriptor *pEVar6;
  once_flag *__once;
  FieldDescriptor *local_60;
  LogMessage local_58;
  
  this_00 = DescriptorPool::FindExtensionByNumber(this->pool_,this->containing_type_,number);
  if (this_00 != (FieldDescriptor *)0x0) {
    if (*(once_flag **)(this_00 + 0x30) == (once_flag *)0x0) {
      __once = (once_flag *)0x0;
    }
    else {
      local_58._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60 = this_00;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this_00 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_58,
                 &local_60);
      __once = *(once_flag **)(this_00 + 0x30);
    }
    uVar2 = *(uint *)(this_00 + 0x38);
    output->type = (FieldType)uVar2;
    output->is_repeated = *(int *)(this_00 + 0x3c) == 3;
    output->is_packed = *(bool *)(*(long *)(this_00 + 0x78) + 0x4c);
    output->descriptor = this_00;
    if (__once != (once_flag *)0x0) {
      local_58._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60 = this_00;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,(_func_void_FieldDescriptor_ptr **)&local_58,&local_60);
      uVar2 = *(uint *)(this_00 + 0x38);
    }
    iVar3 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar2 * 4);
    if (iVar3 == 10) {
      pMVar1 = this->factory_;
      pDVar4 = FieldDescriptor::message_type(this_00);
      iVar3 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar4);
      (output->field_3).enum_validity_check.func =
           (EnumValidityFuncWithArg *)CONCAT44(extraout_var,iVar3);
      if ((EnumValidityFuncWithArg *)CONCAT44(extraout_var,iVar3) == (EnumValidityFuncWithArg *)0x0)
      {
        LogMessage::LogMessage
                  (&local_58,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0x134);
        pLVar5 = LogMessage::operator<<
                           (&local_58,"CHECK failed: output->message_info.prototype != nullptr: ");
        pLVar5 = LogMessage::operator<<
                           (pLVar5,
                            "Extension factory\'s GetPrototype() returned NULL for extension: ");
        pLVar5 = LogMessage::operator<<(pLVar5,*(string **)(this_00 + 8));
        LogFinisher::operator=((LogFinisher *)&local_60,pLVar5);
        LogMessage::~LogMessage(&local_58);
      }
    }
    else {
      if (*(once_flag **)(this_00 + 0x30) != (once_flag *)0x0) {
        local_58._0_8_ = FieldDescriptor::TypeOnceInit;
        local_60 = this_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this_00 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_58,
                   &local_60);
        iVar3 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this_00 + 0x38) * 4);
      }
      if (iVar3 == 8) {
        (output->field_3).enum_validity_check.func = ValidateEnumUsingDescriptor;
        pEVar6 = FieldDescriptor::enum_type(this_00);
        (output->field_3).enum_validity_check.arg = pEVar6;
      }
    }
  }
  return this_00 != (FieldDescriptor *)0x0;
}

Assistant:

bool DescriptorPoolExtensionFinder::Find(int number, ExtensionInfo* output) {
  const FieldDescriptor* extension =
      pool_->FindExtensionByNumber(containing_type_, number);
  if (extension == NULL) {
    return false;
  } else {
    output->type = extension->type();
    output->is_repeated = extension->is_repeated();
    output->is_packed = extension->options().packed();
    output->descriptor = extension;
    if (extension->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      output->message_info.prototype =
          factory_->GetPrototype(extension->message_type());
      GOOGLE_CHECK(output->message_info.prototype != nullptr)
          << "Extension factory's GetPrototype() returned NULL for extension: "
          << extension->full_name();
    } else if (extension->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      output->enum_validity_check.func = ValidateEnumUsingDescriptor;
      output->enum_validity_check.arg = extension->enum_type();
    }

    return true;
  }
}